

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

cf_bool_t cf_lite_queue_push_front(cf_lite_queue_t *self,void *data)

{
  cf_bool_t cVar1;
  void *data_local;
  cf_lite_queue_t *self_local;
  
  if (data == (void *)0x0) {
    self_local._4_4_ = 0;
  }
  else if ((self->count == self->capacity) && (cVar1 = cf_lite_queue_extend(self), cVar1 == 0)) {
    self_local._4_4_ = 0;
  }
  else {
    if (self->count == 0) {
      self->head = 0;
      self->tail = 0;
    }
    else {
      self->head = (cf_uint_t)(((self->capacity + (ulong)self->head) - 1) % self->capacity);
    }
    cf_memcpy_s((cf_void_t *)((long)self->items + self->elm_size * (ulong)self->head),self->elm_size
                ,data,self->elm_size);
    self->count = self->count + 1;
    self_local._4_4_ = 1;
  }
  return self_local._4_4_;
}

Assistant:

cf_bool_t cf_lite_queue_push_front(cf_lite_queue_t* self, void* data) {
    if (!data) {
        return CF_FALSE;
    }

    if (self->count == self->capacity) {
        if (!cf_lite_queue_extend(self)) {
            return CF_FALSE;
        }
    }

    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->head = (self->capacity + self->head - 1) % self->capacity;
    }
    cf_memcpy_s((void*)&((((cf_uint8_t*)(self->items))[self->elm_size * self->head])), \
        self->elm_size, data, self->elm_size);
    self->count++;
    return CF_TRUE;
}